

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * coda_strnstr(char *s,char *n,size_t len)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  
  if ((s != (char *)0x0) && (*s != '\0')) {
    if (n == (char *)0x0) {
      return s;
    }
    cVar1 = *n;
    if (cVar1 == '\0') {
      return s;
    }
    sVar2 = strlen(n);
    if (sVar2 <= len) {
      pcVar4 = s + len;
      for (; s < pcVar4; s = s + 1) {
        if (*s == cVar1) {
          for (sVar3 = 0;
              ((s + sVar3 < pcVar4 && (n + sVar3 < n + sVar2)) && (s[sVar3] == n[sVar3]));
              sVar3 = sVar3 + 1) {
          }
          if (sVar2 == sVar3) {
            return s;
          }
        }
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *coda_strnstr(const char *s, const char *n, size_t len)
{
	size_t nsz;
	const char *es, *en;
	const char *w;
	const char *x;

	if (!s || !*s) return NULL;
	if (!n || !*n) return (char *) s;

	if (len < (nsz = strlen(n))) return NULL;

	es = s + len;
	en = n + nsz;

	for (; s < es; ++s)
	{
		if (*s == *n)
		{
			for (w = s, x = n; w < es && x < en; ++w, ++x)
			{
				if (*w != *x) break;
			}

			if (x == en) return (char *) s;
		}
	}

	return NULL;
}